

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall QTextureFileData::setGLFormat(QTextureFileData *this,quint32 format)

{
  QTextureFileDataPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QTextureFileDataPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QTextureFileDataPrivate>::detach_helper(&this->d);
    }
    ((this->d).d.ptr)->format = format;
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }